

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void __thiscall
Eigen::internal::gemm_pack_rhs<double,_long,_4,_1,_false,_true>::operator()
          (gemm_pack_rhs<double,_long,_4,_1,_false,_true> *this,double *blockB,double *rhs,
          long rhsStride,long depth,long cols,long stride,long offset)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  if ((depth <= stride) && (offset <= stride)) {
    lVar1 = cols / 4;
    lVar2 = lVar1 * 4;
    lVar9 = 0;
    lVar8 = 0;
    if (0 < depth) {
      lVar8 = depth;
    }
    pdVar6 = rhs + 3;
    lVar7 = 0;
    for (; SBORROW8(lVar9,lVar2) != lVar9 + lVar1 * -4 < 0; lVar9 = lVar9 + 4) {
      pdVar5 = blockB + offset * 4 + lVar7 + 3;
      lVar7 = lVar7 + stride * 4 + depth * -4;
      lVar3 = lVar8;
      pdVar4 = pdVar6;
      while (bVar10 = lVar3 != 0, lVar3 = lVar3 + -1, bVar10) {
        pdVar5[-3] = pdVar4[-3];
        pdVar5[-2] = pdVar4[-2];
        pdVar5[-1] = pdVar4[-1];
        *pdVar5 = *pdVar4;
        pdVar4 = pdVar4 + rhsStride;
        lVar7 = lVar7 + 4;
        pdVar5 = pdVar5 + 4;
      }
      pdVar6 = pdVar6 + 4;
    }
    pdVar6 = rhs + lVar1 * 4;
    for (; lVar2 < cols; lVar2 = lVar2 + 1) {
      pdVar4 = pdVar6;
      for (lVar1 = 0; lVar8 != lVar1; lVar1 = lVar1 + 1) {
        blockB[lVar7 + offset + lVar1] = *pdVar4;
        pdVar4 = pdVar4 + rhsStride;
      }
      lVar7 = lVar7 + (stride - depth) + lVar1;
      pdVar6 = pdVar6 + 1;
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x4fb,
                "void Eigen::internal::gemm_pack_rhs<double, long, 4, 1, false, true>::operator()(Scalar *, const Scalar *, Index, Index, Index, Index, Index) [Scalar = double, Index = long, nr = 4, StorageOrder = 1, Conjugate = false, PanelMode = true]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, nr, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const Scalar* rhs, Index rhsStride, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS ROWMAJOR");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols = (cols/nr) * nr;
  Index count = 0;
  for(Index j2=0; j2<packet_cols; j2+=nr)
  {
    // skip what we have before
    if(PanelMode) count += nr * offset;
    for(Index k=0; k<depth; k++)
    {
      const Scalar* b0 = &rhs[k*rhsStride + j2];
                blockB[count+0] = cj(b0[0]);
                blockB[count+1] = cj(b0[1]);
      if(nr==4) blockB[count+2] = cj(b0[2]);
      if(nr==4) blockB[count+3] = cj(b0[3]);
      count += nr;
    }
    // skip what we have after
    if(PanelMode) count += nr * (stride-offset-depth);
  }
  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const Scalar* b0 = &rhs[j2];
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(b0[k*rhsStride]);
      count += 1;
    }
    if(PanelMode) count += stride-offset-depth;
  }
}